

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsingleshottimer_p.cpp
# Opt level: O0

void QSingleShotTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QSingleShotTimer *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    timeout((QSingleShotTimer *)0x42701f);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QSingleShotTimer::*)()>(in_RCX,(void **)timeout,0,0);
  }
  return;
}

Assistant:

void QSingleShotTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSingleShotTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->timeout(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSingleShotTimer::*)()>(_a, &QSingleShotTimer::timeout, 0))
            return;
    }
}